

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImFont::RenderText(ImFont *this,ImDrawList *draw_list,float size,ImVec2 pos,ImU32 col,
                  ImVec4 *clip_rect,char *text_begin,char *text_end,float wrap_width,
                  bool cpu_fine_clip)

{
  ImDrawCmd *pIVar1;
  char cVar2;
  ushort uVar3;
  ImDrawVert *__src;
  unsigned_short *__src_00;
  ImDrawIdx *pIVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  long lVar9;
  ImFontGlyph *pIVar10;
  ImDrawVert *__dest;
  unsigned_short *__dest_00;
  char *pcVar11;
  ImDrawIdx IVar12;
  uint uVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  ImDrawVert *pIVar17;
  uint uVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  uint c;
  char *local_d0;
  uint local_b4;
  ImDrawIdx *local_b0;
  ImU32 local_a4;
  int local_a0;
  int local_9c;
  float local_98;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  ulong local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  fVar28 = pos.x;
  fVar21 = pos.y;
  local_98 = size;
  if (text_end == (char *)0x0) {
    fStack_80 = in_XMM1_Dc;
    local_88 = (undefined1  [8])pos;
    fStack_7c = in_XMM1_Dd;
    sVar8 = strlen(text_begin);
    text_end = text_begin + sVar8;
    fVar28 = (float)local_88._0_4_;
    fVar21 = (float)local_88._4_4_;
    in_XMM1_Dc = fStack_80;
    in_XMM1_Dd = fStack_7c;
  }
  local_68 = (this->DisplayOffset).x + (float)(int)fVar28;
  fStack_64 = (this->DisplayOffset).y + (float)(int)fVar21;
  fStack_60 = (float)(int)in_XMM1_Dc + 0.0;
  fStack_5c = (float)(int)in_XMM1_Dd + 0.0;
  if (fStack_64 < clip_rect->w || fStack_64 == clip_rect->w) {
    local_98 = local_98 / this->FontSize;
    fVar28 = this->FontSize * local_98;
    pcVar16 = text_begin;
    if ((wrap_width <= 0.0) && (text_begin < text_end && fStack_64 + fVar28 < clip_rect->y)) {
      do {
        pcVar16 = text_begin;
        if (*text_begin == '\n') break;
        text_begin = text_begin + 1;
        pcVar16 = text_end;
      } while (text_begin != text_end);
    }
    iVar6 = (int)text_end - (int)pcVar16;
    local_9c = iVar6 * 6;
    local_a0 = (draw_list->IdxBuffer).Size;
    local_a4 = col;
    ImDrawList::PrimReserve(draw_list,local_9c,iVar6 * 4);
    pIVar17 = draw_list->_VtxWritePtr;
    local_b0 = draw_list->_IdxWritePtr;
    if (pcVar16 < text_end) {
      local_70 = (ulong)draw_list->_VtxCurrentIdx;
      local_48 = local_98;
      fStack_44 = local_98;
      fStack_40 = local_98;
      fStack_3c = local_98;
      local_d0 = (char *)0x0;
      fVar21 = local_68;
      fVar20 = fStack_64;
      fVar22 = fStack_60;
      fVar24 = fStack_5c;
      fVar34 = local_68;
      fVar30 = fStack_64;
      fVar31 = fStack_60;
      fVar32 = fStack_5c;
      fVar35 = local_68;
      fVar36 = fStack_60;
      fVar37 = fStack_5c;
      fVar19 = local_68;
      fVar33 = fStack_64;
      fVar23 = fStack_60;
      fVar25 = fStack_5c;
      pcVar14 = pcVar16;
      pcVar11 = local_d0;
      do {
        while (fStack_4c = fVar25, fStack_50 = fVar23, fStack_54 = fVar33, local_58 = fVar19,
              pcVar15 = pcVar14, fVar19 = fVar34, fVar33 = fVar30, fVar23 = fVar31, fVar25 = fVar32,
              pcVar5 = pcVar11, wrap_width <= 0.0) {
LAB_001a120f:
          local_d0 = pcVar5;
          local_b4 = (uint)*pcVar15;
          if (*pcVar15 < '\0') {
            local_58 = fVar19;
            fStack_54 = fVar33;
            fStack_50 = fVar23;
            fStack_4c = fVar25;
            iVar6 = ImTextCharFromUtf8(&local_b4,pcVar15,text_end);
            if (local_b4 == 0) goto LAB_001a15da;
            pcVar15 = pcVar15 + iVar6;
            fVar19 = local_58;
            fVar20 = fStack_54;
            fVar23 = fStack_50;
            fVar25 = fStack_4c;
            fVar35 = local_68;
            fVar36 = fStack_60;
            fVar37 = fStack_5c;
          }
          else {
            pcVar15 = pcVar15 + 1;
            fVar20 = fVar33;
          }
          pcVar16 = pcVar15;
          fVar22 = fVar23;
          fVar24 = fVar25;
          if (local_b4 < 0x20) {
            fVar21 = fVar19;
            if (local_b4 != 0xd) {
              if (local_b4 != 10) goto LAB_001a12ff;
              fVar20 = fVar20 + fVar28;
              if (clip_rect->w <= fVar20 && fVar20 != clip_rect->w) goto LAB_001a15da;
              fVar21 = fVar35;
              fVar22 = fVar36;
              fVar24 = fVar37;
              if (((wrap_width <= 0.0) && (fVar20 + fVar28 < clip_rect->y)) && (pcVar15 < text_end))
              {
                lVar9 = (long)text_end - (long)pcVar15;
                do {
                  pcVar16 = pcVar15;
                  if (*pcVar15 == '\n') break;
                  pcVar15 = pcVar15 + 1;
                  lVar9 = lVar9 + -1;
                  pcVar16 = text_end;
                } while (lVar9 != 0);
              }
            }
          }
          else {
LAB_001a12ff:
            if (((int)(local_b4 & 0xffff) < (this->IndexLookup).Size) &&
               (uVar3 = (this->IndexLookup).Data[local_b4 & 0xffff], uVar3 != 0xffff)) {
              pIVar10 = (ImFontGlyph *)
                        ((long)&((this->Glyphs).Data)->Codepoint + (ulong)((uint)uVar3 * 0x28));
            }
            else {
              pIVar10 = this->FallbackGlyph;
            }
            if (pIVar10 == (ImFontGlyph *)0x0) {
              fVar21 = 0.0;
            }
            else {
              fVar21 = pIVar10->AdvanceX * local_98;
              if ((local_b4 != 9) && (local_b4 != 0x20)) {
                fVar30 = pIVar10->X0 * local_48 + fVar19;
                fVar31 = pIVar10->Y0 * fStack_44 + fVar20;
                fVar32 = pIVar10->X1 * fStack_40 + fVar19;
                fVar33 = pIVar10->Y1 * fStack_3c + fVar20;
                fVar34 = clip_rect->z;
                if ((fVar30 <= fVar34) && (fVar23 = clip_rect->x, fVar23 <= fVar32)) {
                  fVar25 = pIVar10->U0;
                  fVar29 = pIVar10->V0;
                  fVar27 = pIVar10->U1;
                  fVar26 = pIVar10->V1;
                  if (cpu_fine_clip) {
                    if (fVar30 < fVar23) {
                      fVar25 = fVar25 + (fVar27 - fVar25) *
                                        (1.0 - (fVar32 - fVar23) / (fVar32 - fVar30));
                      fVar30 = fVar23;
                    }
                    fVar23 = clip_rect->y;
                    if (fVar31 < fVar23) {
                      local_88._0_4_ = fVar25;
                      fVar29 = fVar29 + (fVar26 - fVar29) *
                                        (1.0 - (fVar33 - fVar23) / (fVar33 - fVar31));
                      fVar31 = fVar23;
                    }
                    if (fVar34 < fVar32) {
                      fVar27 = (fVar27 - fVar25) * ((fVar34 - fVar30) / (fVar32 - fVar30)) + fVar25;
                      fVar32 = fVar34;
                    }
                    fVar34 = clip_rect->w;
                    if (fVar34 < fVar33) {
                      fVar26 = (fVar26 - fVar29) * ((fVar34 - fVar31) / (fVar33 - fVar31)) + fVar29;
                      fVar33 = fVar34;
                    }
                    if (fVar33 <= fVar31) goto LAB_001a13f6;
                  }
                  IVar12 = (ImDrawIdx)local_70;
                  *local_b0 = IVar12;
                  local_b0[1] = IVar12 + 1;
                  local_b0[2] = IVar12 + 2;
                  local_b0[3] = IVar12;
                  local_b0[4] = IVar12 + 2;
                  local_b0[5] = IVar12 + 3;
                  (pIVar17->pos).x = fVar30;
                  (pIVar17->pos).y = fVar31;
                  pIVar17->col = local_a4;
                  (pIVar17->uv).x = fVar25;
                  (pIVar17->uv).y = fVar29;
                  pIVar17[1].pos.x = fVar32;
                  pIVar17[1].pos.y = fVar31;
                  pIVar17[1].col = local_a4;
                  pIVar17[1].uv.x = fVar27;
                  pIVar17[1].uv.y = fVar29;
                  pIVar17[2].pos.x = fVar32;
                  pIVar17[2].pos.y = fVar33;
                  pIVar17[2].col = local_a4;
                  pIVar17[2].uv.x = fVar27;
                  pIVar17[2].uv.y = fVar26;
                  pIVar17[3].pos.x = fVar30;
                  pIVar17[3].pos.y = fVar33;
                  pIVar17[3].col = local_a4;
                  pIVar17[3].uv.x = fVar25;
                  pIVar17[3].uv.y = fVar26;
                  pIVar17 = pIVar17 + 4;
                  local_70 = (ulong)((int)local_70 + 4);
                  local_b0 = local_b0 + 6;
                }
                fVar21 = fVar19 + fVar21;
                goto LAB_001a1400;
              }
            }
LAB_001a13f6:
            fVar21 = fVar19 + fVar21;
          }
LAB_001a1400:
          fVar34 = fVar21;
          fVar30 = fVar20;
          fVar31 = fVar22;
          fVar32 = fVar24;
          fVar19 = fVar21;
          fVar33 = fVar20;
          fVar23 = fVar22;
          fVar25 = fVar24;
          pcVar14 = pcVar16;
          pcVar11 = local_d0;
          if (text_end <= pcVar16) goto LAB_001a15da;
        }
        fVar19 = fVar21;
        fVar33 = fVar20;
        fVar23 = fVar22;
        fVar25 = fVar24;
        if (local_d0 == (char *)0x0) {
          local_88._4_4_ = fVar20;
          local_88._0_4_ = fVar21;
          fStack_80 = fVar22;
          fStack_7c = fVar24;
          local_d0 = CalcWordWrapPositionA
                               (this,local_98,pcVar16,text_end,(fVar35 - fVar21) + wrap_width);
          local_d0 = local_d0 + (local_d0 == pcVar16);
          fVar19 = (float)local_88._0_4_;
          fVar33 = (float)local_88._4_4_;
          fVar23 = fStack_80;
          fVar25 = fStack_7c;
          fVar34 = local_58;
          fVar30 = fStack_54;
          fVar31 = fStack_50;
          fVar32 = fStack_4c;
          fVar35 = local_68;
          fVar36 = fStack_60;
          fVar37 = fStack_5c;
        }
        pcVar15 = pcVar16;
        pcVar5 = local_d0;
        if (pcVar16 < local_d0) goto LAB_001a120f;
        if (pcVar16 < text_end) {
          lVar9 = (long)text_end - (long)pcVar16;
          do {
            cVar2 = *pcVar16;
            if ((cVar2 != ' ') && (cVar2 != '\t')) {
              pcVar15 = pcVar16;
              if (cVar2 == '\n') {
                pcVar15 = pcVar16 + 1;
              }
              break;
            }
            pcVar16 = pcVar16 + 1;
            lVar9 = lVar9 + -1;
            pcVar15 = text_end;
          } while (lVar9 != 0);
        }
        local_d0 = (char *)0x0;
        pcVar16 = pcVar15;
        fVar21 = fVar35;
        fVar20 = fVar33 + fVar28;
        fVar22 = fVar36;
        fVar24 = fVar37;
        fVar19 = local_58;
        fVar33 = fStack_54;
        fVar23 = fStack_50;
        fVar25 = fStack_4c;
      } while (pcVar15 < text_end);
    }
LAB_001a15da:
    pIVar4 = local_b0;
    iVar7 = (int)((ulong)((long)pIVar17 - (long)(draw_list->VtxBuffer).Data) >> 2);
    uVar13 = iVar7 * -0x33333333;
    iVar6 = (draw_list->VtxBuffer).Capacity;
    if (SBORROW4(iVar6,uVar13) != iVar6 + iVar7 * 0x33333333 < 0) {
      if (iVar6 == 0) {
        uVar18 = 8;
      }
      else {
        uVar18 = iVar6 / 2 + iVar6;
      }
      if ((int)uVar18 <= (int)uVar13) {
        uVar18 = uVar13;
      }
      __dest = (ImDrawVert *)ImGui::MemAlloc((long)(int)uVar18 * 0x14);
      __src = (draw_list->VtxBuffer).Data;
      if (__src != (ImDrawVert *)0x0) {
        memcpy(__dest,__src,(long)(draw_list->VtxBuffer).Size * 0x14);
        ImGui::MemFree((draw_list->VtxBuffer).Data);
      }
      (draw_list->VtxBuffer).Data = __dest;
      (draw_list->VtxBuffer).Capacity = uVar18;
    }
    (draw_list->VtxBuffer).Size = uVar13;
    iVar6 = (draw_list->IdxBuffer).Capacity;
    iVar7 = (int)((ulong)((long)pIVar4 - (long)(draw_list->IdxBuffer).Data) >> 1);
    if (iVar6 < iVar7) {
      if (iVar6 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar6 / 2 + iVar6;
      }
      if (iVar6 <= iVar7) {
        iVar6 = iVar7;
      }
      __dest_00 = (unsigned_short *)ImGui::MemAlloc((long)iVar6 * 2);
      __src_00 = (draw_list->IdxBuffer).Data;
      if (__src_00 != (unsigned_short *)0x0) {
        memcpy(__dest_00,__src_00,(long)(draw_list->IdxBuffer).Size * 2);
        ImGui::MemFree((draw_list->IdxBuffer).Data);
      }
      (draw_list->IdxBuffer).Data = __dest_00;
      (draw_list->IdxBuffer).Capacity = iVar6;
      uVar13 = (draw_list->VtxBuffer).Size;
    }
    (draw_list->IdxBuffer).Size = iVar7;
    pIVar1 = (draw_list->CmdBuffer).Data + (long)(draw_list->CmdBuffer).Size + -1;
    pIVar1->ElemCount = pIVar1->ElemCount + (iVar7 - (local_9c + local_a0));
    draw_list->_VtxWritePtr = pIVar17;
    draw_list->_IdxWritePtr = pIVar4;
    draw_list->_VtxCurrentIdx = uVar13;
  }
  return;
}

Assistant:

void ImFont::RenderText(ImDrawList* draw_list, float size, ImVec2 pos, ImU32 col, const ImVec4& clip_rect, const char* text_begin, const char* text_end, float wrap_width, bool cpu_fine_clip) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // ImGui functions generally already provides a valid text_end, so this is merely to handle direct calls.

    // Align to be pixel perfect
    pos.x = (float)(int)pos.x + DisplayOffset.x;
    pos.y = (float)(int)pos.y + DisplayOffset.y;
    float x = pos.x;
    float y = pos.y;
    if (y > clip_rect.w)
        return;

    const float scale = size / FontSize;
    const float line_height = FontSize * scale;
    const bool word_wrap_enabled = (wrap_width > 0.0f);
    const char* word_wrap_eol = NULL;

    // Skip non-visible lines
    const char* s = text_begin;
    if (!word_wrap_enabled && y + line_height < clip_rect.y)
        while (s < text_end && *s != '\n')  // Fast-forward to next line
            s++;

    // Reserve vertices for remaining worse case (over-reserving is useful and easily amortized)
    const int vtx_count_max = (int)(text_end - s) * 4;
    const int idx_count_max = (int)(text_end - s) * 6;
    const int idx_expected_size = draw_list->IdxBuffer.Size + idx_count_max;
    draw_list->PrimReserve(idx_count_max, vtx_count_max);

    ImDrawVert* vtx_write = draw_list->_VtxWritePtr;
    ImDrawIdx* idx_write = draw_list->_IdxWritePtr;
    unsigned int vtx_current_idx = draw_list->_VtxCurrentIdx;

    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
            {
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - (x - pos.x));
                if (word_wrap_eol == s) // Wrap_width is too small to fit anything. Force displaying 1 character to minimize the height discontinuity.
                    word_wrap_eol++;    // +1 may not be a character start point in UTF-8 but it's ok because we use s >= word_wrap_eol below
            }

            if (s >= word_wrap_eol)
            {
                x = pos.x;
                y += line_height;
                word_wrap_eol = NULL;

                // Wrapping skips upcoming blanks
                while (s < text_end)
                {
                    const char c = *s;
                    if (ImCharIsBlankA(c)) { s++; } else if (c == '\n') { s++; break; } else { break; }
                }
                continue;
            }
        }

        // Decode and advance source
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
        {
            s += 1;
        }
        else
        {
            s += ImTextCharFromUtf8(&c, s, text_end);
            if (c == 0) // Malformed UTF-8?
                break;
        }

        if (c < 32)
        {
            if (c == '\n')
            {
                x = pos.x;
                y += line_height;

                if (y > clip_rect.w)
                    break;
                if (!word_wrap_enabled && y + line_height < clip_rect.y)
                    while (s < text_end && *s != '\n')  // Fast-forward to next line
                        s++;
                continue;
            }
            if (c == '\r')
                continue;
        }

        float char_width = 0.0f;
        if (const ImFontGlyph* glyph = FindGlyph((unsigned short)c))
        {
            char_width = glyph->AdvanceX * scale;

            // Arbitrarily assume that both space and tabs are empty glyphs as an optimization
            if (c != ' ' && c != '\t')
            {
                // We don't do a second finer clipping test on the Y axis as we've already skipped anything before clip_rect.y and exit once we pass clip_rect.w
                float x1 = x + glyph->X0 * scale;
                float x2 = x + glyph->X1 * scale;
                float y1 = y + glyph->Y0 * scale;
                float y2 = y + glyph->Y1 * scale;
                if (x1 <= clip_rect.z && x2 >= clip_rect.x)
                {
                    // Render a character
                    float u1 = glyph->U0;
                    float v1 = glyph->V0;
                    float u2 = glyph->U1;
                    float v2 = glyph->V1;

                    // CPU side clipping used to fit text in their frame when the frame is too small. Only does clipping for axis aligned quads.
                    if (cpu_fine_clip)
                    {
                        if (x1 < clip_rect.x)
                        {
                            u1 = u1 + (1.0f - (x2 - clip_rect.x) / (x2 - x1)) * (u2 - u1);
                            x1 = clip_rect.x;
                        }
                        if (y1 < clip_rect.y)
                        {
                            v1 = v1 + (1.0f - (y2 - clip_rect.y) / (y2 - y1)) * (v2 - v1);
                            y1 = clip_rect.y;
                        }
                        if (x2 > clip_rect.z)
                        {
                            u2 = u1 + ((clip_rect.z - x1) / (x2 - x1)) * (u2 - u1);
                            x2 = clip_rect.z;
                        }
                        if (y2 > clip_rect.w)
                        {
                            v2 = v1 + ((clip_rect.w - y1) / (y2 - y1)) * (v2 - v1);
                            y2 = clip_rect.w;
                        }
                        if (y1 >= y2)
                        {
                            x += char_width;
                            continue;
                        }
                    }

                    // We are NOT calling PrimRectUV() here because non-inlined causes too much overhead in a debug builds. Inlined here:
                    {
                        idx_write[0] = (ImDrawIdx)(vtx_current_idx); idx_write[1] = (ImDrawIdx)(vtx_current_idx+1); idx_write[2] = (ImDrawIdx)(vtx_current_idx+2);
                        idx_write[3] = (ImDrawIdx)(vtx_current_idx); idx_write[4] = (ImDrawIdx)(vtx_current_idx+2); idx_write[5] = (ImDrawIdx)(vtx_current_idx+3);
                        vtx_write[0].pos.x = x1; vtx_write[0].pos.y = y1; vtx_write[0].col = col; vtx_write[0].uv.x = u1; vtx_write[0].uv.y = v1;
                        vtx_write[1].pos.x = x2; vtx_write[1].pos.y = y1; vtx_write[1].col = col; vtx_write[1].uv.x = u2; vtx_write[1].uv.y = v1;
                        vtx_write[2].pos.x = x2; vtx_write[2].pos.y = y2; vtx_write[2].col = col; vtx_write[2].uv.x = u2; vtx_write[2].uv.y = v2;
                        vtx_write[3].pos.x = x1; vtx_write[3].pos.y = y2; vtx_write[3].col = col; vtx_write[3].uv.x = u1; vtx_write[3].uv.y = v2;
                        vtx_write += 4;
                        vtx_current_idx += 4;
                        idx_write += 6;
                    }
                }
            }
        }

        x += char_width;
    }

    // Give back unused vertices
    draw_list->VtxBuffer.resize((int)(vtx_write - draw_list->VtxBuffer.Data));
    draw_list->IdxBuffer.resize((int)(idx_write - draw_list->IdxBuffer.Data));
    draw_list->CmdBuffer[draw_list->CmdBuffer.Size-1].ElemCount -= (idx_expected_size - draw_list->IdxBuffer.Size);
    draw_list->_VtxWritePtr = vtx_write;
    draw_list->_IdxWritePtr = idx_write;
    draw_list->_VtxCurrentIdx = (unsigned int)draw_list->VtxBuffer.Size;
}